

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment_o1.cc
# Opt level: O3

VectorXd __thiscall lf::geometry::SegmentO1::IntegrationElement(SegmentO1 *this,MatrixXd *local)

{
  Index *pIVar1;
  Index rows;
  double *pdVar2;
  _func_int **pp_Var3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  long lVar6;
  ulong uVar7;
  long in_RDX;
  long extraout_RDX;
  ulong uVar8;
  ActualDstType actualDst;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true>_>
  *pCVar9;
  undefined8 *puVar10;
  byte bVar11;
  double __tmp;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  VectorXd VVar15;
  scalar_constant_op<double> local_1a8;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_1a0 [3];
  long local_158;
  MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true>,_0> local_118;
  Index *local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  Index local_e8;
  MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true>,_0> local_e0;
  Index *local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  Index local_b0;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true>_>
  local_a8;
  
  bVar11 = 0;
  rows = *(Index *)(in_RDX + 0x10);
  pIVar1 = &(local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
            m_rows;
  lVar6 = (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols
  ;
  Eigen::MapBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_-1,_1,_true>,_0>::
  MapBase(&local_e0,
          (PointerType)
          (lVar6 * 8 +
          (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows
          ),lVar6,1);
  local_c0 = 0;
  local_b8 = 1;
  local_b0 = (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_cols;
  local_c8 = pIVar1;
  Eigen::MapBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_-1,_1,_true>,_0>::
  MapBase(&local_118,
          (PointerType)
          (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows
          ,local_b0,1);
  local_f8 = 0;
  uStack_f0 = 0;
  local_e8 = (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_cols;
  local_100 = pIVar1;
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_-1,_1,_true>_>
  ::CwiseBinaryOp(&local_a8,(Lhs *)&local_e0,(Rhs *)&local_118,
                  (scalar_difference_op<double,_double> *)local_1a0);
  pCVar9 = &local_a8;
  puVar10 = (undefined8 *)&local_1a0[0].field_0x8;
  for (lVar6 = 0xe; lVar6 != 0; lVar6 = lVar6 + -1) {
    *puVar10 = (pCVar9->m_lhs).
               super_BlockImpl<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true,_Eigen::Dense>
               .
               super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true,_true>
               .
               super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true>,_0>
               .m_data;
    pCVar9 = (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true>_>
              *)((long)pCVar9 + (ulong)bVar11 * -0x10 + 8);
    puVar10 = puVar10 + (ulong)bVar11 * -2 + 1;
  }
  if (local_158 == 0) {
    dVar12 = 0.0;
  }
  else {
    dVar12 = Eigen::
             DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,-1,2,0,-1,2>const,-1,1,true>const,Eigen::Block<Eigen::Matrix<double,-1,2,0,-1,2>const,-1,1,true>const>const>>
             ::redux<Eigen::internal::scalar_sum_op<double,double>>
                       ((DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,2,0,_1,2>const,_1,1,true>const,Eigen::Block<Eigen::Matrix<double,_1,2,0,_1,2>const,_1,1,true>const>const>>
                         *)local_1a0,(scalar_sum_op<double,_double> *)&local_1a8);
  }
  local_1a8.m_other = SQRT(dVar12);
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
  ::CwiseNullaryOp(local_1a0,rows,1,&local_1a8);
  (this->super_Geometry)._vptr_Geometry = (_func_int **)0x0;
  (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>.m_storage.m_data =
       (double *)0x0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this,
             local_1a0[0].m_rows.m_value,1);
  Eigen::internal::
  resize_if_allowed<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>,double,double>
            ((Matrix<double,__1,_1,_0,__1,_1> *)this,local_1a0,
             (assign_op<double,_double> *)&local_1a8);
  auVar5 = _DAT_001e7f30;
  auVar4 = _DAT_001e7f20;
  pdVar2 = (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>.m_storage.
           m_data;
  lVar6 = extraout_RDX;
  if (0 < (long)pdVar2) {
    pp_Var3 = (this->super_Geometry)._vptr_Geometry;
    uVar7 = (long)pdVar2 + 0x1fffffffffffffff;
    uVar8 = uVar7 & 0x1fffffffffffffff;
    auVar13._8_4_ = (int)uVar8;
    auVar13._0_8_ = uVar8;
    auVar13._12_4_ = (int)(uVar8 >> 0x20);
    lVar6 = 0;
    auVar13 = auVar13 ^ _DAT_001e7f30;
    do {
      auVar14._8_4_ = (int)lVar6;
      auVar14._0_8_ = lVar6;
      auVar14._12_4_ = (int)((ulong)lVar6 >> 0x20);
      auVar14 = (auVar14 | auVar4) ^ auVar5;
      if ((bool)(~(auVar14._4_4_ == auVar13._4_4_ && auVar13._0_4_ < auVar14._0_4_ ||
                  auVar13._4_4_ < auVar14._4_4_) & 1)) {
        pp_Var3[lVar6] = (_func_int *)local_1a0[0].m_functor.m_other;
      }
      if ((auVar14._12_4_ != auVar13._12_4_ || auVar14._8_4_ <= auVar13._8_4_) &&
          auVar14._12_4_ <= auVar13._12_4_) {
        pp_Var3[lVar6 + 1] = (_func_int *)local_1a0[0].m_functor.m_other;
      }
      lVar6 = lVar6 + 2;
    } while ((uVar8 - ((uint)uVar7 & 1)) + 2 != lVar6);
  }
  VVar15.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = lVar6;
  VVar15.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (VectorXd)VVar15.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Eigen::VectorXd SegmentO1::IntegrationElement(
    const Eigen::MatrixXd& local) const {
  return Eigen::VectorXd::Constant(local.cols(),
                                   (coords_.col(1) - coords_.col(0)).norm());
}